

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFPageObjectHelper::externalizeInlineImages
          (QPDFPageObjectHelper *this,size_t min_size,bool shallow)

{
  bool bVar1;
  QPDF *pQVar2;
  anon_class_8_1_96603b4c local_2e0;
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2d8;
  undefined1 local_2b8 [24];
  string local_2a0;
  undefined1 local_280 [40];
  string local_258;
  undefined1 local_238 [48];
  undefined1 local_208 [16];
  undefined1 local_1f8 [160];
  exception *e;
  undefined1 local_150 [7];
  bool filtered;
  Pl_Buffer b;
  undefined1 local_108 [24];
  InlineImageTracker iit;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  QPDFObjectHandle resources;
  bool shallow_local;
  size_t min_size_local;
  QPDFPageObjectHelper *this_local;
  
  resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = shallow;
  if (shallow) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"/Resources",&local_51);
    getAttribute((QPDFPageObjectHelper *)local_30,(string *)this,SUB81(local_50,0));
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    operator____qpdf((char *)&iit.state,0x41907b);
    QPDFObjectHandle::mergeResources
              ((QPDFObjectHandle *)local_30,(QPDFObjectHandle *)&iit.state,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                *)0x0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&iit.state);
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_108);
    pQVar2 = QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)local_108);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&b.m,(QPDFObjectHandle *)local_30);
    anon_unknown.dwarf_40e0be::InlineImageTracker::InlineImageTracker
              ((InlineImageTracker *)(local_108 + 0x10),pQVar2,min_size,(QPDFObjectHandle *)&b.m);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&b.m);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_108);
    Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_150,"new page content",(Pipeline *)0x0);
    e._7_1_ = 0;
    filterContents(this,(TokenFilter *)(local_108 + 0x10),(Pipeline *)local_150);
    e._7_1_ = 1;
    if ((iit.bi_str.field_2._M_local_buf[0xc] & 1U) != 0) {
      QPDFObjectHelper::oh((QPDFObjectHelper *)(local_1f8 + 0x10));
      bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)(local_1f8 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_1f8 + 0x10));
      if (bVar1) {
        QPDFObjectHelper::oh((QPDFObjectHelper *)local_1f8);
        Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)local_208);
        QPDFObjectHandle::newNull();
        QPDFObjectHandle::newNull();
        QPDFObjectHandle::replaceStreamData
                  ((QPDFObjectHandle *)local_1f8,(shared_ptr<Buffer> *)local_208,
                   (QPDFObjectHandle *)(local_238 + 0x20),(QPDFObjectHandle *)(local_238 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_238 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_238 + 0x20));
        std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_208);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1f8);
      }
      else {
        QPDFObjectHelper::oh((QPDFObjectHelper *)local_238);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"/Contents",(allocator<char> *)(local_280 + 0x27));
        QPDFObjectHelper::oh((QPDFObjectHelper *)local_280);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"",(allocator<char> *)(local_2b8 + 0x17));
        pQVar2 = QPDFObjectHandle::getQPDF((QPDFObjectHandle *)local_280,&local_2a0);
        Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)local_2b8);
        QPDFObjectHandle::newStream
                  ((QPDFObjectHandle *)(local_280 + 0x10),pQVar2,(shared_ptr<Buffer> *)local_2b8);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)local_238,&local_258,(QPDFObjectHandle *)(local_280 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_280 + 0x10));
        std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_2b8);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator((allocator<char> *)(local_2b8 + 0x17));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_280);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator((allocator<char> *)(local_280 + 0x27));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_238);
      }
    }
    Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_150);
    anon_unknown.dwarf_40e0be::InlineImageTracker::~InlineImageTracker
              ((InlineImageTracker *)(local_108 + 0x10));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  }
  else {
    externalizeInlineImages(this,min_size,true);
    local_2e0.min_size = min_size;
    std::function<void(QPDFObjectHandle&,QPDFObjectHandle&,std::__cxx11::string_const&)>::
    function<QPDFPageObjectHelper::externalizeInlineImages(unsigned_long,bool)::__0,void>
              ((function<void(QPDFObjectHandle&,QPDFObjectHandle&,std::__cxx11::string_const&)> *)
               &local_2d8,&local_2e0);
    forEachFormXObject(this,true,&local_2d8);
    std::
    function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_2d8);
  }
  return;
}

Assistant:

void
QPDFPageObjectHelper::externalizeInlineImages(size_t min_size, bool shallow)
{
    if (shallow) {
        QPDFObjectHandle resources = getAttribute("/Resources", true);
        // Calling mergeResources also ensures that /XObject becomes direct and is not shared with
        // other pages.
        resources.mergeResources("<< /XObject << >> >>"_qpdf);
        InlineImageTracker iit(oh().getOwningQPDF(), min_size, resources);
        Pl_Buffer b("new page content");
        bool filtered = false;
        try {
            filterContents(&iit, &b);
            filtered = true;
        } catch (std::exception& e) {
            oh().warnIfPossible(
                std::string("Unable to filter content stream: ") + e.what() +
                "; not attempting to externalize inline images from this stream");
        }
        if (filtered && iit.any_images) {
            if (oh().isFormXObject()) {
                oh().replaceStreamData(
                    b.getBufferSharedPointer(),
                    QPDFObjectHandle::newNull(),
                    QPDFObjectHandle::newNull());
            } else {
                oh().replaceKey(
                    "/Contents",
                    QPDFObjectHandle::newStream(&oh().getQPDF(), b.getBufferSharedPointer()));
            }
        }
    } else {
        externalizeInlineImages(min_size, true);
        forEachFormXObject(
            true, [min_size](QPDFObjectHandle& obj, QPDFObjectHandle&, std::string const&) {
                QPDFPageObjectHelper(obj).externalizeInlineImages(min_size, true);
            });
    }
}